

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear.h
# Opt level: O3

void __thiscall PMP_Multilinear_Hasher::~PMP_Multilinear_Hasher(PMP_Multilinear_Hasher *this)

{
  this->_vptr_PMP_Multilinear_Hasher = (_func_int **)&PTR__PMP_Multilinear_Hasher_001cfd48;
  if (this->base_addr != (uchar *)0x0) {
    operator_delete__(this->base_addr);
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

virtual ~PMP_Multilinear_Hasher()
  {
#ifdef PMPML_USE_SSE
    if ( base_addr != NULL )
        delete [] base_addr;
#else
    if ( curr_rd != NULL && curr_rd != rd_for_MPSHF )
        delete [] curr_rd;
#endif
  }